

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O2

void __thiscall
cab_manager::add_request(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  shared_ptr<cab> cab;
  
  find_cab((cab_manager *)&cab,(node_type)this,src,(uint32_t)CONCAT71(in_register_00000011,dst));
  if (cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"found no cab for request ");
    poVar1 = ::operator<<(poVar1,src);
    poVar1 = std::operator<<(poVar1," --> ");
    poVar1 = ::operator<<(poVar1,dst);
    std::operator<<(poVar1,'\n');
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"found cab with id ");
    ::cab::id(cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," for request ");
    poVar1 = ::operator<<(poVar1,src);
    poVar1 = std::operator<<(poVar1," --> ");
    poVar1 = ::operator<<(poVar1,dst);
    std::operator<<(poVar1,'\n');
    ::cab::add_request(cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,src,dst,
                       passengers);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void cab_manager::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    std::shared_ptr<cab> cab = find_cab(src, dst, passengers);
    if(cab == nullptr)
    {
        std::cout << "found no cab for request " << src << " --> " << dst << '\n';
        return;
    }

    std::cout << "found cab with id " << cab->id() << " for request " << src << " --> " << dst << '\n';
    cab->add_request(src, dst, passengers);
}